

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

Node * makeSequence(Node *e)

{
  Node *pNVar1;
  
  pNVar1 = e;
  if (e->type != 0xb) {
    pNVar1 = (Node *)calloc(1,0x28);
    pNVar1->type = 0xb;
    (pNVar1->rule).errblock = (char *)0x0;
    if ((e->rule).next != (Node *)0x0) {
      __assert_fail("!e->any.next",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/3rd/greg/tree.c"
                    ,0xce,"Node *makeSequence(Node *)");
    }
    (pNVar1->rule).variables = e;
    (pNVar1->name).rule = e;
  }
  return pNVar1;
}

Assistant:

Node *makeSequence(Node *e)
{
  if (Sequence != e->type)
    {
      Node *node= newNode(Sequence);
      assert(e);
      assert(!e->any.next);
      node->sequence.first=
	node->sequence.last= e;
      return node;
    }
  return e;
}